

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2212.c
# Opt level: O3

void internal_refresh(void)

{
  e_uint32 eVar1;
  e_uint32 eVar2;
  char cVar3;
  e_uint32 block;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  e_uint32 (*paaeVar8) [8] [16];
  e_uint32 (*paeVar9) [16];
  e_uint32 fnum;
  long lVar10;
  e_int32 Rks;
  ulong uVar11;
  e_uint32 eVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  eVar2 = clk;
  eVar1 = rate;
  dVar15 = (double)clk;
  dVar14 = (double)rate;
  paaeVar8 = dphaseTable;
  lVar10 = 0;
  do {
    lVar5 = 0;
    paeVar9 = *paaeVar8;
    do {
      lVar13 = 0;
      do {
        uVar6 = (uint)(*(int *)((long)&DAT_00115520 + lVar13) * (int)lVar10 << ((byte)lVar5 & 0x1f))
                >> 2;
        if (eVar1 != 0xc234) {
          uVar6 = (uint)(long)((((double)uVar6 * dVar15) / 72.0) / dVar14 + 0.5);
        }
        *(uint *)((long)*(e_uint32 (*) [16])*paeVar9 + lVar13) = uVar6;
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0x40);
      lVar5 = lVar5 + 1;
      paeVar9 = paeVar9 + 1;
    } while (lVar5 != 8);
    lVar10 = lVar10 + 1;
    paaeVar8 = (e_uint32 (*) [8] [16])((long)paaeVar8 + 0x200);
  } while (lVar10 != 0x200);
  paeVar9 = dphaseARTable;
  lVar10 = 0;
  do {
    uVar11 = 0;
    do {
      iVar7 = (int)lVar10;
      eVar12 = 0;
      if ((iVar7 != 0) && (eVar12 = 0, iVar7 != 0xf)) {
        uVar6 = ((uint)(uVar11 >> 2) & 0x3fffffff) + iVar7;
        cVar3 = (char)uVar6;
        if (0xe < uVar6) {
          cVar3 = '\x0f';
        }
        eVar12 = ((uint)uVar11 & 3) * 3 + 0xc << (cVar3 + 1U & 0x1f);
        if (eVar1 != 0xc234) {
          eVar12 = (e_uint32)(long)((((double)(int)eVar12 * dVar15) / 72.0) / dVar14 + 0.5);
        }
      }
      (*paeVar9)[uVar11] = eVar12;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0x10);
    lVar10 = lVar10 + 1;
    paeVar9 = paeVar9 + 1;
  } while (lVar10 != 0x10);
  lVar10 = 0;
  paeVar9 = dphaseDRTable;
  do {
    uVar6 = 0;
    lVar5 = 0;
    do {
      if (lVar10 == 0) {
        *(undefined4 *)((long)dphaseDRTable[0] + lVar5) = 0;
      }
      else {
        uVar4 = (uVar6 >> 2) + (int)lVar10;
        cVar3 = (char)uVar4;
        if (0xe < uVar4) {
          cVar3 = '\x0f';
        }
        iVar7 = (uVar6 & 3 | 4) << (cVar3 - 1U & 0x1f);
        if (eVar1 != 0xc234) {
          iVar7 = (int)(long)((((double)iVar7 * dVar15) / 72.0) / dVar14 + 0.5);
        }
        *(int *)((long)*paeVar9 + lVar5) = iVar7;
      }
      lVar5 = lVar5 + 4;
      uVar6 = uVar6 + 1;
    } while (lVar5 != 0x40);
    lVar10 = lVar10 + 1;
    paeVar9 = paeVar9 + 1;
  } while (lVar10 != 0x10);
  dVar17 = (double)(eVar2 / 0x48);
  dVar16 = 419430.4 / dVar17;
  if (eVar1 == 0xc234) {
    dVar17 = 238636.2368 / dVar17;
  }
  else {
    dVar16 = ((dVar16 * dVar15) / 72.0) / dVar14 + 0.5;
    dVar17 = (double)((long)((((238636.2368 / dVar17) * dVar15) / 72.0) / dVar14 + 0.5) & 0xffffffff
                     );
  }
  pm_dphase = (e_uint32)(long)dVar16;
  am_dphase = (e_uint32)(long)dVar17;
  return;
}

Assistant:

static void
internal_refresh (SCC * scc)
{
  if (scc->quality)
  {
    scc->base_incr = 2 << GETA_BITS;
    scc->realstep = (e_uint32) ((1 << 31) / scc->rate);
    scc->sccstep = (e_uint32) ((1 << 31) / (scc->clk / 2));
    scc->scctime = 0;
  }
  else
  {
    scc->base_incr = (e_uint32) ((double) scc->clk * (1 << GETA_BITS) / scc->rate);
  }
}